

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::CVmObjTable(CVmObjTable *this)

{
  this->image_ptr_head_ = (vm_image_ptr_page *)0x0;
  this->post_load_init_table_ = (CVmHashTable *)0x0;
  this->globals_ = (CVmObjGlobPage *)0x0;
  this->global_var_head_ = (vm_globalvar_t *)0x0;
  this->pages_ = (CVmObjPageEntry **)0x0;
  this->page_slots_ = 0;
  this->pages_used_ = 0;
  return;
}

Assistant:

CVmObjTable::CVmObjTable()
{
    pages_ = 0;
    page_slots_ = 0;
    pages_used_ = 0;
    image_ptr_head_ = 0;
    globals_ = 0;
    global_var_head_ = 0;
    post_load_init_table_ = 0;
}